

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O0

bool __thiscall zmq::ypipe_t<zmq::msg_t,_256>::unwrite(ypipe_t<zmq::msg_t,_256> *this,msg_t *value_)

{
  yqueue_t<zmq::msg_t,_256> *pyVar1;
  msg_t *__src;
  void *in_RSI;
  long in_RDI;
  yqueue_t<zmq::msg_t,_256> *this_00;
  
  this_00 = *(yqueue_t<zmq::msg_t,_256> **)(in_RDI + 0x50);
  pyVar1 = (yqueue_t<zmq::msg_t,_256> *)
           yqueue_t<zmq::msg_t,_256>::back((yqueue_t<zmq::msg_t,_256> *)(in_RDI + 8));
  if (this_00 != pyVar1) {
    yqueue_t<zmq::msg_t,_256>::unpush(this_00);
    __src = yqueue_t<zmq::msg_t,_256>::back((yqueue_t<zmq::msg_t,_256> *)(in_RDI + 8));
    memcpy(in_RSI,__src,0x40);
  }
  return this_00 != pyVar1;
}

Assistant:

bool unwrite (T *value_)
    {
        if (_f == &_queue.back ())
            return false;
        _queue.unpush ();
        *value_ = _queue.back ();
        return true;
    }